

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O0

bool __thiscall wasm::WasmSplitOptions::validate(WasmSplitOptions *this)

{
  Mode MVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  size_type sVar4;
  ostream *poVar5;
  long lVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  stringstream local_1c8 [8];
  stringstream msg;
  ostream local_1b8 [376];
  key_type *local_40;
  string *opt;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  anon_class_8_1_a8c67f1c fail;
  bool valid;
  WasmSplitOptions *this_local;
  
  fail.valid._7_1_ = 1;
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&fail.valid + 7);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->inputFiles);
  if (sVar3 == 0) {
    validate()::$_0::operator()((__0 *)&__range1,"no input file");
  }
  MVar1 = this->mode;
  if (MVar1 < MergeProfiles) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->inputFiles);
    if (1 < sVar3) {
      validate()::$_0::operator()((__0 *)&__range1,"Cannot have more than one input file.");
    }
  }
  else if (((MVar1 != MergeProfiles) && (MVar1 == PrintProfile)) &&
          (sVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&this->inputFiles), sVar3 != 1)) {
    validate()::$_0::operator()((__0 *)&__range1,"Must have exactly one profile path.");
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->usedOptions);
  opt = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->usedOptions);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&opt), bVar2) {
    local_40 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    this_00 = std::
              array<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
              ::operator[](&this->validOptions,(ulong)this->mode);
    sVar4 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(this_00,local_40);
    if (sVar4 == 0) {
      std::__cxx11::stringstream::stringstream(local_1c8);
      poVar5 = std::operator<<(local_1b8,"Option ");
      poVar5 = std::operator<<(poVar5,(string *)local_40);
      poVar5 = std::operator<<(poVar5," cannot be used in ");
      poVar5 = anon_unknown_12::operator<<(poVar5,&this->mode);
      std::operator<<(poVar5," mode.");
      std::__cxx11::stringstream::str();
      validate()::$_0::operator()((__0 *)&__range1,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::stringstream::~stringstream(local_1c8);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if (this->mode == Split) {
    lVar6 = std::__cxx11::string::size();
    if ((lVar6 != 0) &&
       (sVar7 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::size
                          (&this->keepFuncs), sVar7 != 0)) {
      validate()::$_0::operator()((__0 *)&__range1,"Cannot use both --profile and --keep-funcs.");
    }
    lVar6 = std::__cxx11::string::size();
    if ((lVar6 != 0) &&
       (sVar7 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::size
                          (&this->splitFuncs), sVar7 != 0)) {
      validate()::$_0::operator()((__0 *)&__range1,"Cannot use both --profile and --split-funcs.");
    }
    sVar7 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::size
                      (&this->keepFuncs);
    if ((sVar7 != 0) &&
       (sVar7 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::size
                          (&this->splitFuncs), sVar7 != 0)) {
      validate()::$_0::operator()
                ((__0 *)&__range1,"Cannot use both --keep-funcs and --split-funcs.");
    }
  }
  return (bool)(fail.valid._7_1_ & 1);
}

Assistant:

bool WasmSplitOptions::validate() {
  bool valid = true;
  auto fail = [&](auto msg) {
    std::cerr << "error: " << msg << "\n";
    valid = false;
  };

  // Validate the positional arguments.
  if (inputFiles.size() == 0) {
    fail("no input file");
  }
  switch (mode) {
    case Mode::Split:
    case Mode::Instrument:
      if (inputFiles.size() > 1) {
        fail("Cannot have more than one input file.");
      }
      break;
    case Mode::MergeProfiles:
      // Any number >= 1 allowed.
      break;
    case Mode::PrintProfile:
      if (inputFiles.size() != 1) {
        fail("Must have exactly one profile path.");
      }
      break;
  }

  // Validate that all used options are allowed in the current mode.
  for (std::string& opt : usedOptions) {
    if (!validOptions[static_cast<unsigned>(mode)].count(opt)) {
      std::stringstream msg;
      msg << "Option " << opt << " cannot be used in " << mode << " mode.";
      fail(msg.str());
    }
  }

  if (mode == Mode::Split) {
    if (profileFile.size() && keepFuncs.size()) {
      fail("Cannot use both --profile and --keep-funcs.");
    }
    if (profileFile.size() && splitFuncs.size()) {
      fail("Cannot use both --profile and --split-funcs.");
    }
    if (keepFuncs.size() && splitFuncs.size()) {
      fail("Cannot use both --keep-funcs and --split-funcs.");
    }
  }

  return valid;
}